

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fn.hpp
# Opt level: O2

status __thiscall
rangeless::mt::
synchronized_queue<rangeless::fn::impl::maybe<long>,rangeless::mt::lockables::atomic_mutex>::
try_push<rangeless::mt::synchronized_queue<rangeless::fn::impl::maybe<long>,rangeless::mt::lockables::atomic_mutex>::no_timeout_sentinel_t>
          (synchronized_queue<rangeless::fn::impl::maybe<long>,rangeless::mt::lockables::atomic_mutex>
           *this,maybe<long> *value)

{
  int iVar1;
  size_type sVar2;
  status sVar3;
  lock_t queue_lock;
  
  lockables::atomic_mutex::lock((atomic_mutex *)(this + 0xb1));
  std::unique_lock<rangeless::mt::lockables::atomic_mutex>::unique_lock
            (&queue_lock,(mutex_type *)(this + 0xb0));
  *(int *)(this + 0x50) = *(int *)(this + 0x50) + 1;
  std::_V2::condition_variable_any::
  wait<std::unique_lock<rangeless::mt::lockables::atomic_mutex>,rangeless::mt::synchronized_queue<rangeless::fn::impl::maybe<long>,rangeless::mt::lockables::atomic_mutex>::try_push<rangeless::mt::synchronized_queue<rangeless::fn::impl::maybe<long>,rangeless::mt::lockables::atomic_mutex>::no_timeout_sentinel_t>(rangeless::fn::impl::maybe<long>&&,rangeless::mt::synchronized_queue<rangeless::fn::impl::maybe<long>,rangeless::mt::lockables::atomic_mutex>::no_timeout_sentinel_t)::_lambda()_1_>
            ((condition_variable_any *)(this + 0xb8),&queue_lock,(anon_class_8_1_8991fb9c)this);
  *(int *)(this + 0x50) = *(int *)(this + 0x50) + -1;
  if (*(long *)(this + 0x58) == 0) {
    sVar3 = closed;
  }
  else {
    sVar2 = std::
            deque<rangeless::fn::impl::maybe<long>,_std::allocator<rangeless::fn::impl::maybe<long>_>_>
            ::size((deque<rangeless::fn::impl::maybe<long>,_std::allocator<rangeless::fn::impl::maybe<long>_>_>
                    *)(this + 0x60));
    if (*(ulong *)(this + 0x58) <= sVar2) {
      __assert_fail("m_queue.size() < m_capacity",
                    "/workspace/llm4binary/github/license_c_cmakelists/ast-al[P]rangeless/include/fn.hpp"
                    ,0x1a41,
                    "status rangeless::mt::synchronized_queue<rangeless::fn::impl::maybe<long>, rangeless::mt::lockables::atomic_mutex>::try_push(value_type &&, Duration) [T = rangeless::fn::impl::maybe<long>, BasicLockable = rangeless::mt::lockables::atomic_mutex, Duration = rangeless::mt::synchronized_queue<rangeless::fn::impl::maybe<long>, rangeless::mt::lockables::atomic_mutex>::no_timeout_sentinel_t]"
                   );
    }
    std::deque<rangeless::fn::impl::maybe<long>,std::allocator<rangeless::fn::impl::maybe<long>>>::
    emplace_back<rangeless::fn::impl::maybe<long>>
              ((deque<rangeless::fn::impl::maybe<long>,std::allocator<rangeless::fn::impl::maybe<long>>>
                *)(this + 0x60),value);
    iVar1 = *(int *)(this + 0x54);
    std::unique_lock<rangeless::mt::lockables::atomic_mutex>::unlock(&queue_lock);
    sVar3 = success;
    if (iVar1 != 0) {
      std::_V2::condition_variable_any::notify_one((condition_variable_any *)(this + 0xf8));
    }
  }
  std::unique_lock<rangeless::mt::lockables::atomic_mutex>::~unique_lock(&queue_lock);
  this[0xb1] = (synchronized_queue<rangeless::fn::impl::maybe<long>,rangeless::mt::lockables::atomic_mutex>
                )0x0;
  return sVar3;
}

Assistant:

status try_push(value_type&& value, Duration timeout = {})
    {
        // NB: we could have taken value as value_type&, but
        // the user-code may forget or not expect that the value 
        // will be moved-from and may try to use it.
        //
        // With rvalue-reference the caller-code has to, e.g.
        //     auto state = queue.try_push(std::move(x));
        //
        // making the move explicitly visible.

        const guard_t contention_guard{ m_push_mutex };

        lock_t queue_lock{ m_queue_mutex };

        ++m_num_waiting_to_push;        
        const bool ok = x_wait_until([this]
            {
                return m_queue.size() < m_capacity || !m_capacity;
            }, 
            m_can_push, queue_lock, timeout);
        --m_num_waiting_to_push;        

        if(!ok) {
            return status::timeout;
        }

        if(!m_capacity) {
             return status::closed;
        }

        assert(m_queue.size() < m_capacity); 

        // if push throws, is the value moved-from?
        // No. std::move is just an rvalue_cast - no-op
        // if the move-assignment never happens.
        m_queue.push(std::move(value));

        const bool do_notify = m_num_waiting_to_pop > 0;
        queue_lock.unlock();

        if(do_notify) {
            m_can_pop.notify_one();
        }

        return status::success;
    }